

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sign.c
# Opt level: O0

int wally_ec_public_key_verify(uchar *pub_key,size_t pub_key_len)

{
  int iVar1;
  undefined1 local_60 [8];
  secp256k1_pubkey pub;
  size_t pub_key_len_local;
  uchar *pub_key_local;
  
  if ((pub_key != (uchar *)0x0) &&
     (((pub_key_len == 0x21 || (pub_key_len == 0x41)) &&
      (pub.data._56_8_ = pub_key_len,
      iVar1 = pubkey_parse((secp256k1_pubkey *)local_60,pub_key,pub_key_len), iVar1 != 0)))) {
    wally_clear(local_60,0x40);
    return 0;
  }
  return -2;
}

Assistant:

int wally_ec_public_key_verify(const unsigned char *pub_key, size_t pub_key_len)
{
    secp256k1_pubkey pub;

    if (!pub_key ||
        !(pub_key_len == EC_PUBLIC_KEY_LEN || pub_key_len == EC_PUBLIC_KEY_UNCOMPRESSED_LEN) ||
        !pubkey_parse(&pub, pub_key, pub_key_len))
        return WALLY_EINVAL;

    wally_clear(&pub, sizeof(pub));
    return WALLY_OK;
}